

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

String * __thiscall
stick::String::concatWithAllocator<stick::String,stick::String>
          (String *__return_storage_ptr__,String *this,Allocator *_alloc,String *_args,
          String *_args_1)

{
  Size SVar1;
  _func_int **pp_Var2;
  Size local_30;
  Size off;
  
  SVar1 = _args->m_length;
  pp_Var2 = _alloc[1]._vptr_Allocator;
  __return_storage_ptr__->m_cStr = (char *)0x0;
  __return_storage_ptr__->m_length = 0;
  __return_storage_ptr__->m_capacity = 0;
  __return_storage_ptr__->m_allocator = (Allocator *)this;
  resize(__return_storage_ptr__,SVar1 + (long)pp_Var2);
  local_30 = 0;
  detail::_StringCopier::performCopy(__return_storage_ptr__,&local_30,(String *)_alloc);
  detail::_StringCopier::performCopy(__return_storage_ptr__,&local_30,_args);
  return __return_storage_ptr__;
}

Assistant:

inline String String::concatWithAllocator(Allocator & _alloc, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    String ret(_alloc);
    ret.resize(len);
    Size off = 0;
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(ret, off, _args))... };
    STICK_UNUSED(unpack2);
    return ret;
}